

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerInvalidRate_Test::
~Sampler_testProbabilisticSamplerInvalidRate_Test
          (Sampler_testProbabilisticSamplerInvalidRate_Test *this)

{
  Sampler_testProbabilisticSamplerInvalidRate_Test *this_local;
  
  ~Sampler_testProbabilisticSamplerInvalidRate_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerInvalidRate)
{
    Config samplerConfig1(kSamplerTypeProbabilistic,
                          1.1,
                          "",
                          0,
                          samplers::Config::Clock::duration());
    Config samplerConfig2(kSamplerTypeProbabilistic,
                          -0.1,
                          "",
                          0,
                          samplers::Config::Clock::duration());
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    ASSERT_THROW(samplerConfig1.makeSampler("test-service", *logger, *metrics),
                 std::invalid_argument);
    ASSERT_THROW(samplerConfig2.makeSampler("test-service", *logger, *metrics),
                 std::invalid_argument);
}